

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  int local_70;
  int local_6c;
  bool *local_68;
  int toPrint_1;
  size_t delta_1;
  int i;
  bool entityPatternPrinted;
  int toPrint;
  size_t delta;
  bool *flag;
  char *q;
  bool *pbStack_18;
  bool restricted_local;
  char *p_local;
  XMLPrinter *this_local;
  
  if ((this->_processEntities & 1U) == 0) {
    Write(this,p);
  }
  else {
    flag = (bool *)p;
    pbStack_18 = (bool *)p;
    if (restricted) {
      local_68 = this->_restrictedEntityFlag;
    }
    else {
      local_68 = this->_entityFlag;
    }
    for (; *flag != false; flag = flag + 1) {
      if ((('\0' < *flag) && (*flag < '@')) && ((local_68[*flag] & 1U) != 0)) {
        for (; pbStack_18 < flag; pbStack_18 = pbStack_18 + local_6c) {
          if ((ulong)((long)flag - (long)pbStack_18) < 0x80000000) {
            local_6c = (int)((long)flag - (long)pbStack_18);
          }
          else {
            local_6c = 0x7fffffff;
          }
          Write(this,pbStack_18,(long)local_6c);
        }
        for (delta_1._4_4_ = 0; delta_1._4_4_ < 5; delta_1._4_4_ = delta_1._4_4_ + 1) {
          if ((bool)entities[(long)delta_1._4_4_ * 0x10 + 0xc] == *flag) {
            Putc(this,'&');
            Write(this,*(char **)(entities + (long)delta_1._4_4_ * 0x10),
                  (long)*(int *)(entities + (long)delta_1._4_4_ * 0x10 + 8));
            Putc(this,';');
            break;
          }
        }
        pbStack_18 = pbStack_18 + 1;
      }
    }
    if (pbStack_18 < flag) {
      if ((ulong)((long)flag - (long)pbStack_18) < 0x80000000) {
        local_70 = (int)((long)flag - (long)pbStack_18);
      }
      else {
        local_70 = 0x7fffffff;
      }
      Write(this,pbStack_18,(long)local_70);
    }
  }
  return;
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[static_cast<unsigned char>(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : static_cast<int>(delta);
                        Write( p, toPrint );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Putc( '&' );
                            Write( entities[i].pattern, entities[i].length );
                            Putc( ';' );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
        // Flush the remaining string. This will be the entire
        // string if an entity wasn't found.
        if ( p < q ) {
            const size_t delta = q - p;
            const int toPrint = ( INT_MAX < delta ) ? INT_MAX : static_cast<int>(delta);
            Write( p, toPrint );
        }
    }
    else {
        Write( p );
    }
}